

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PArena.cpp
# Opt level: O0

bool __thiscall amrex::PArena::isHostAccessible(PArena *this)

{
  PArena *this_local;
  
  return true;
}

Assistant:

bool
PArena::isHostAccessible () const
{
#ifdef AMREX_USE_GPU
#ifdef AMREX_CUDA_GE_11_2
    if (Gpu::Device::memoryPoolsSupported()) {
        return false; // cudaMallocAsync allocates device memory
    } else
#endif
    {
        return The_Arena()->isHostAccessible();
    }
#else
    return true;
#endif
}